

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.cc
# Opt level: O2

bool __thiscall
sptk::RealValuedFastFourierTransform::Run
          (RealValuedFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  ulong uVar1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  pointer pdVar9;
  pointer pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_type __new_size;
  ulong __n;
  int iVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar7 = false;
  bVar8 = false;
  if (((buffer != (Buffer *)0x0) &&
      (bVar8 = bVar7, imag_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar14 = this->num_order_;
    lVar15 = (long)iVar14;
    uVar1 = lVar15 + 1;
    if ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar1) {
      this_00 = &buffer->real_part_input_;
      __new_size = (size_type)this->half_fft_length_;
      if ((long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
        __new_size = (size_type)this->half_fft_length_;
      }
      this_01 = &buffer->imag_part_input_;
      if ((long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      __n = (ulong)this->fft_length_;
      if ((ulong)((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) < __n) {
        std::vector<double,_std::allocator<double>_>::reserve(real_part_output,__n);
        __n = (ulong)this->fft_length_;
      }
      if ((ulong)((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) < __n) {
        std::vector<double,_std::allocator<double>_>::reserve(imag_part_output,__n);
      }
      pdVar10 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar12 = 0; lVar12 <= lVar15; lVar12 = lVar12 + 2) {
        *(double *)((long)pdVar9 + lVar12 * 4) = pdVar10[lVar12];
        if (lVar15 <= lVar12) {
          pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          break;
        }
        *(double *)
         ((long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar12 * 4) = pdVar10[lVar12 + 1];
      }
      pdVar10 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (pdVar9 = pdVar9 + (iVar14 + 2) / 2; pdVar9 != pdVar10; pdVar9 = pdVar9 + 1) {
        *pdVar9 = 0.0;
      }
      pdVar9 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pdVar10 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                          2); pdVar10 != pdVar9; pdVar10 = pdVar10 + 1) {
        *pdVar10 = 0.0;
      }
      bVar8 = FastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,this_01,real_part_output,
                         imag_part_output);
      if (bVar8) {
        std::vector<double,_std::allocator<double>_>::resize
                  (real_part_output,(long)this->fft_length_);
        std::vector<double,_std::allocator<double>_>::resize
                  (imag_part_output,(long)this->fft_length_);
        pdVar4 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = this->fft_length_;
        lVar11 = (long)iVar14;
        iVar3 = this->half_fft_length_;
        lVar15 = (long)iVar3;
        pdVar4[lVar15] = *pdVar4 - *pdVar5;
        *pdVar4 = *pdVar4 + *pdVar5;
        pdVar5[lVar15] = 0.0;
        *pdVar5 = 0.0;
        pdVar9 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = (long)(iVar14 / 4) * 8 + 8;
        iVar14 = 1;
        lVar13 = 0;
        lVar12 = lVar11;
        while( true ) {
          lVar12 = lVar12 + -1;
          lVar15 = lVar15 + -1;
          if (iVar3 <= iVar14) break;
          dVar2 = *(double *)((long)pdVar4 + lVar13 + 8);
          dVar16 = dVar2 - pdVar4[lVar15];
          dVar17 = *(double *)((long)pdVar5 + lVar13 + 8) + pdVar5[lVar15];
          pdVar4[lVar12] =
               ((*(double *)((long)pdVar9 + lVar13 + lVar6) * dVar17 + dVar2 + pdVar4[lVar15]) -
               *(double *)((long)pdVar9 + lVar13 + 8) * dVar16) * 0.5;
          pdVar5[lVar12] =
               (dVar16 * *(double *)((long)pdVar9 + lVar13 + lVar6) +
               dVar17 * *(double *)((long)pdVar9 + lVar13 + 8) +
               (pdVar5[lVar15] - *(double *)((long)pdVar5 + lVar13 + 8))) * 0.5;
          iVar14 = iVar14 + 1;
          lVar13 = lVar13 + 8;
        }
        for (lVar15 = 1; lVar11 = lVar11 + -1, (int)lVar15 < iVar3; lVar15 = lVar15 + 1) {
          pdVar4[lVar15] = pdVar4[lVar11];
          pdVar5[lVar15] = -pdVar5[lVar11];
        }
        bVar8 = true;
      }
      else {
        bVar8 = false;
      }
    }
  }
  return bVar8;
}

Assistant:

bool RealValuedFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    RealValuedFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_order_ + 1);
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(input_length) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->real_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->real_part_input_.resize(half_fft_length_);
  }
  if (buffer->imag_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->imag_part_input_.resize(half_fft_length_);
  }
  if (real_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    real_part_output->reserve(fft_length_);
  }
  if (imag_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    imag_part_output->reserve(fft_length_);
  }

  // Copy input and fill zero.
  for (int i(0), j(0); i < input_length; ++j) {
    buffer->real_part_input_[j] = real_part_input[i++];
    if (input_length <= i) break;
    buffer->imag_part_input_[j] = real_part_input[i++];
  }
  std::fill(buffer->real_part_input_.begin() + (input_length + 1) / 2,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + input_length / 2,
            buffer->imag_part_input_.end(), 0.0);

  // Run fast Fourier transform.
  if (!fast_fourier_transform_.Run(buffer->real_part_input_,
                                   buffer->imag_part_input_, real_part_output,
                                   imag_part_output)) {
    return false;
  }
  real_part_output->resize(fft_length_);
  imag_part_output->resize(fft_length_);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));
  double* xp(x);
  double* yp(y);
  double* xq(xp + fft_length_);
  double* yq(yp + fft_length_);
  *(xp + half_fft_length_) = *xp - *yp;
  *xp = *xp + *yp;
  *(yp + half_fft_length_) = 0.0;
  *yp = 0.0;

  const double* sinp(&(sine_table_[0]));
  const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
  for (int i(1), j(half_fft_length_ - 2); i < half_fft_length_; ++i, j -= 2) {
    ++xp;
    ++yp;
    ++sinp;
    ++cosp;
    const double xt(*xp - *(xp + j));
    const double yt(*yp + *(yp + j));
    *(--xq) = (*xp + *(xp + j) + *cosp * yt - *sinp * xt) * 0.5;
    *(--yq) = (-*yp + *(yp + j) + *sinp * yt + *cosp * xt) * 0.5;
  }

  xp = x + 1;
  yp = y + 1;
  xq = x + fft_length_;
  yq = y + fft_length_;
  for (int i(1); i < half_fft_length_; ++i) {
    *xp++ = *(--xq);
    *yp++ = -(*(--yq));
  }

  return true;
}